

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

void qclab::printMatrix2x2<qclab::dense::SquareMatrix<double>>(SquareMatrix<double> *mat)

{
  int64_t iVar1;
  double *pdVar2;
  SquareMatrix<double> *mat_local;
  
  iVar1 = dense::SquareMatrix<double>::rows(mat);
  if (iVar1 != 2) {
    __assert_fail("mat.rows() == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/include/qclab/util.hpp"
                  ,0x61,
                  "void qclab::printMatrix2x2(const T &) [T = qclab::dense::SquareMatrix<double>]");
  }
  iVar1 = dense::SquareMatrix<double>::cols(mat);
  if (iVar1 == 2) {
    pdVar2 = dense::SquareMatrix<double>::operator()(mat,0,0);
    print<double>(*pdVar2);
    pdVar2 = dense::SquareMatrix<double>::operator()(mat,0,1);
    print<double>(*pdVar2);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    pdVar2 = dense::SquareMatrix<double>::operator()(mat,1,0);
    print<double>(*pdVar2);
    pdVar2 = dense::SquareMatrix<double>::operator()(mat,1,1);
    print<double>(*pdVar2);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    return;
  }
  __assert_fail("mat.cols() == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/include/qclab/util.hpp"
                ,0x62,
                "void qclab::printMatrix2x2(const T &) [T = qclab::dense::SquareMatrix<double>]");
}

Assistant:

void printMatrix2x2( const T& mat ) {
    assert( mat.rows() == 2 ) ;
    assert( mat.cols() == 2 ) ;
    print( mat(0,0) ) ; print( mat(0,1) ) ; std::cout << std::endl ;
    print( mat(1,0) ) ; print( mat(1,1) ) ; std::cout << std::endl ;
  }